

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3AuthRead(Parse *pParse,Expr *pExpr,Schema *pSchema,SrcList *pTabList)

{
  int iVar1;
  int iCol;
  int iDb;
  int iSrc;
  char *zCol;
  Table *pTab;
  sqlite3 *db;
  SrcList *pTabList_local;
  Schema *pSchema_local;
  Expr *pExpr_local;
  Parse *pParse_local;
  
  zCol = (char *)0x0;
  if ((pParse->db->xAuth != (sqlite3_xauth)0x0) &&
     (iVar1 = sqlite3SchemaToIndex(pParse->db,pSchema), -1 < iVar1)) {
    if (pExpr->op == 'X') {
      zCol = (char *)pParse->pTriggerTab;
    }
    else {
      for (iCol = 0; iCol < pTabList->nSrc; iCol = iCol + 1) {
        if (pExpr->iTable == pTabList->a[iCol].iCursor) {
          zCol = (char *)pTabList->a[iCol].pTab;
          break;
        }
      }
    }
    if (zCol != (char *)0x0) {
      if (pExpr->iColumn < 0) {
        if (*(short *)(zCol + 0x40) < 0) {
          _iDb = "ROWID";
        }
        else {
          _iDb = *(char **)(*(long *)(zCol + 8) + (long)*(short *)(zCol + 0x40) * 0x20);
        }
      }
      else {
        _iDb = *(char **)(*(long *)(zCol + 8) + (long)(int)pExpr->iColumn * 0x20);
      }
      iVar1 = sqlite3AuthReadCol(pParse,*(char **)zCol,_iDb,iVar1);
      if (iVar1 == 2) {
        pExpr->op = 'e';
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AuthRead(
  Parse *pParse,        /* The parser context */
  Expr *pExpr,          /* The expression to check authorization on */
  Schema *pSchema,      /* The schema of the expression */
  SrcList *pTabList     /* All table that pExpr might refer to */
){
  sqlite3 *db = pParse->db;
  Table *pTab = 0;      /* The table being read */
  const char *zCol;     /* Name of the column of the table */
  int iSrc;             /* Index in pTabList->a[] of table being read */
  int iDb;              /* The index of the database the expression refers to */
  int iCol;             /* Index of column in table */

  if( db->xAuth==0 ) return;
  iDb = sqlite3SchemaToIndex(pParse->db, pSchema);
  if( iDb<0 ){
    /* An attempt to read a column out of a subquery or other
    ** temporary table. */
    return;
  }

  assert( pExpr->op==TK_COLUMN || pExpr->op==TK_TRIGGER );
  if( pExpr->op==TK_TRIGGER ){
    pTab = pParse->pTriggerTab;
  }else{
    assert( pTabList );
    for(iSrc=0; ALWAYS(iSrc<pTabList->nSrc); iSrc++){
      if( pExpr->iTable==pTabList->a[iSrc].iCursor ){
        pTab = pTabList->a[iSrc].pTab;
        break;
      }
    }
  }
  iCol = pExpr->iColumn;
  if( NEVER(pTab==0) ) return;

  if( iCol>=0 ){
    assert( iCol<pTab->nCol );
    zCol = pTab->aCol[iCol].zName;
  }else if( pTab->iPKey>=0 ){
    assert( pTab->iPKey<pTab->nCol );
    zCol = pTab->aCol[pTab->iPKey].zName;
  }else{
    zCol = "ROWID";
  }
  assert( iDb>=0 && iDb<db->nDb );
  if( SQLITE_IGNORE==sqlite3AuthReadCol(pParse, pTab->zName, zCol, iDb) ){
    pExpr->op = TK_NULL;
  }
}